

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
          (MultiSampleState *this,MultiSampleState *other)

{
  ulong uVar1;
  uint *__first;
  pointer puVar2;
  pointer puVar3;
  allocator_type local_39;
  pointer local_38;
  pointer puStack_30;
  pointer local_28;
  
  (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_VkPipelineMultisampleStateCreateInfo).sType =
       (other->super_VkPipelineMultisampleStateCreateInfo).sType;
  (this->super_VkPipelineMultisampleStateCreateInfo).pNext =
       (other->super_VkPipelineMultisampleStateCreateInfo).pNext;
  (this->super_VkPipelineMultisampleStateCreateInfo).flags =
       (other->super_VkPipelineMultisampleStateCreateInfo).flags;
  uVar1._0_4_ = (other->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples;
  uVar1._4_4_ = (other->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable;
  (this->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples = (undefined4)uVar1;
  (this->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable = uVar1._4_4_;
  (this->super_VkPipelineMultisampleStateCreateInfo).minSampleShading =
       (other->super_VkPipelineMultisampleStateCreateInfo).minSampleShading;
  __first = (other->super_VkPipelineMultisampleStateCreateInfo).pSampleMask;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,__first,
             __first + ((uVar1 & 0xffffffff) + 0x20 >> 5),&local_39);
  puVar2 = (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puStack_30;
  (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_28;
  local_38 = (pointer)0x0;
  puStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
  }
  (this->super_VkPipelineMultisampleStateCreateInfo).pSampleMask =
       (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  return;
}

Assistant:

PipelineCreateInfo::MultiSampleState::MultiSampleState (const MultiSampleState& other)
{
	sType					= other.sType;
	pNext					= other.pNext;
	flags					= other.flags;
	rasterizationSamples	= other.rasterizationSamples;
	sampleShadingEnable		= other.sampleShadingEnable;
	minSampleShading		= other.minSampleShading;

	const size_t sampleMaskArrayLen = (sizeof(vk::VkSampleMask) * 8 + other.rasterizationSamples) / (sizeof(vk::VkSampleMask) * 8);

	m_sampleMask	= std::vector<vk::VkSampleMask>(other.pSampleMask, other.pSampleMask + sampleMaskArrayLen);
	pSampleMask		= &m_sampleMask[0];
}